

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeader_p.cpp
# Opt level: O3

string * __thiscall
BamTools::Internal::HttpRequestHeader::ToString_abi_cxx11_
          (string *__return_storage_ptr__,HttpRequestHeader *this)

{
  ostream *poVar1;
  stringstream request;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,(this->m_method)._M_dataplus._M_p,(this->m_method)._M_string_length)
  ;
  local_1c0._M_dataplus._M_p._0_1_ = 0x20;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1c0,1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->m_resource)._M_dataplus._M_p,(this->m_resource)._M_string_length
                     );
  local_1c0._M_dataplus._M_p._0_1_ = 0x20;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1c0,1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,Constants::HTTP_STRING_abi_cxx11_,DAT_001f57c8);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_HttpHeader).m_majorVersion);
  local_1c0._M_dataplus._M_p._0_1_ = 0x2e;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1c0,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_HttpHeader).m_minorVersion);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,Constants::FIELD_NEWLINE_abi_cxx11_,DAT_001f5788);
  HttpHeader::ToString_abi_cxx11_(&local_1c0,&this->super_HttpHeader);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)CONCAT71(local_1c0._M_dataplus._M_p._1_7_,
                                              local_1c0._M_dataplus._M_p._0_1_),
                      local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,Constants::FIELD_NEWLINE_abi_cxx11_,DAT_001f5788);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1c0._M_dataplus._M_p._1_7_,local_1c0._M_dataplus._M_p._0_1_) !=
      &local_1c0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1c0._M_dataplus._M_p._1_7_,local_1c0._M_dataplus._M_p._0_1_));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string HttpRequestHeader::ToString() const
{
    std::stringstream request;
    request << m_method << Constants::SPACE_CHAR << m_resource << Constants::SPACE_CHAR
            << Constants::HTTP_STRING << GetMajorVersion() << Constants::DOT_CHAR
            << GetMinorVersion() << Constants::FIELD_NEWLINE << HttpHeader::ToString()
            << Constants::FIELD_NEWLINE;
    return request.str();
}